

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void init_live_ranges(gen_ctx_t gen_ctx)

{
  lr_ctx *plVar1;
  bitmap_t pVVar2;
  gen_ctx_t gen_ctx_local;
  
  plVar1 = (lr_ctx *)gen_malloc(gen_ctx,0x68);
  gen_ctx->lr_ctx = plVar1;
  VARR_intcreate(&gen_ctx->lr_ctx->var_to_scan_var_map,0);
  VARR_MIR_reg_tcreate(&gen_ctx->lr_ctx->scan_var_to_var_map,0);
  init_lr_bbs(gen_ctx);
  init_lrs(gen_ctx);
  VARR_live_range_tcreate(&gen_ctx->lr_ctx->var_live_ranges,0);
  VARR_intcreate(&gen_ctx->lr_ctx->point_map,0x400);
  pVVar2 = bitmap_create2(0x100);
  gen_ctx->lr_ctx->live_vars = pVVar2;
  pVVar2 = bitmap_create2(0x100);
  gen_ctx->lr_ctx->referenced_vars = pVVar2;
  pVVar2 = bitmap_create2(0x100);
  gen_ctx->lr_ctx->points_with_born_vars = pVVar2;
  pVVar2 = bitmap_create2(0x100);
  gen_ctx->lr_ctx->points_with_dead_vars = pVVar2;
  pVVar2 = bitmap_create2(0x100);
  gen_ctx->lr_ctx->points_with_born_or_dead_vars = pVVar2;
  return;
}

Assistant:

static void init_live_ranges (gen_ctx_t gen_ctx) {
  gen_ctx->lr_ctx = gen_malloc (gen_ctx, sizeof (struct lr_ctx));
  VARR_CREATE (int, var_to_scan_var_map, 0);
  VARR_CREATE (MIR_reg_t, scan_var_to_var_map, 0);
  init_lr_bbs (gen_ctx);
  init_lrs (gen_ctx);
  VARR_CREATE (live_range_t, var_live_ranges, 0);
  VARR_CREATE (int, point_map, 1024);
  live_vars = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  referenced_vars = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  points_with_born_vars = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  points_with_dead_vars = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
  points_with_born_or_dead_vars = bitmap_create2 (DEFAULT_INIT_BITMAP_BITS_NUM);
}